

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O2

void tb_page_add(uc_struct_conflict15 *uc,PageDesc *p,TranslationBlock_conflict *tb,uint n,
                tb_page_addr_t page_addr)

{
  uintptr_t uVar1;
  ulong uVar2;
  
  uVar2 = (ulong)n;
  tb->page_addr[uVar2] = page_addr;
  uVar1 = p->first_tb;
  tb->page_next[uVar2] = uVar1;
  p->first_tb = uVar2 | (ulong)tb;
  invalidate_page_bitmap(p);
  if (uVar1 != 0) {
    return;
  }
  tlb_protect_code_tricore(uc,page_addr);
  return;
}

Assistant:

static inline void tb_page_add(struct uc_struct *uc, PageDesc *p, TranslationBlock *tb,
                               unsigned int n, tb_page_addr_t page_addr)
{
    bool page_already_protected;

    assert_page_locked(p);

    tb->page_addr[n] = page_addr;
    tb->page_next[n] = p->first_tb;
    page_already_protected = p->first_tb != (uintptr_t)NULL;
    p->first_tb = (uintptr_t)tb | n;
    invalidate_page_bitmap(p);

    /* if some code is already present, then the pages are already
       protected. So we handle the case where only the first TB is
       allocated in a physical page */
    if (!page_already_protected) {
        tlb_protect_code(uc, page_addr);
    }
}